

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O2

Aig_Obj_t ** Fra_RefineClassOne(Fra_Cla_t *p,Aig_Obj_t **ppClass)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t **ppAVar4;
  Aig_Obj_t **ppAVar5;
  long lVar6;
  
  if ((*ppClass != (Aig_Obj_t *)0x0) && (pAVar2 = ppClass[1], pAVar2 != (Aig_Obj_t *)0x0)) {
    ppAVar4 = ppClass + 1;
    ppAVar5 = ppClass + 2;
    while( true ) {
      if (pAVar2 == (Aig_Obj_t *)0x0) {
        return (Aig_Obj_t **)0x0;
      }
      iVar1 = (*p->pFuncNodesAreEqual)(*ppClass,pAVar2);
      if (iVar1 == 0) break;
      pAVar2 = *ppAVar5;
      ppAVar5 = ppAVar5 + 1;
    }
    p_00 = p->vClassOld;
    p_00->nSize = 0;
    p->vClassNew->nSize = 0;
    Vec_PtrPush(p_00,*ppClass);
    for (; pAVar2 = *ppAVar4, pAVar2 != (Aig_Obj_t *)0x0; ppAVar4 = ppAVar4 + 1) {
      iVar1 = (*p->pFuncNodesAreEqual)(*ppClass,pAVar2);
      Vec_PtrPush((&p->vClassOld)[iVar1 == 0],pAVar2);
    }
    lVar6 = 0;
    while( true ) {
      iVar1 = p->vClassOld->nSize;
      if (iVar1 <= lVar6) break;
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vClassOld,(int)lVar6);
      ppClass[lVar6] = pAVar2;
      ppClass[p->vClassOld->nSize + lVar6] = (Aig_Obj_t *)0x0;
      if (lVar6 == 0) {
        pAVar3 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar3 = *ppClass;
      }
      *(Aig_Obj_t **)
       (*(long *)(*(long *)((long)(pAVar2->field_5).pData + 0x30) + 8) + (long)pAVar2->Id * 8) =
           pAVar3;
      lVar6 = lVar6 + 1;
    }
    ppAVar4 = ppClass + iVar1 * 2;
    for (lVar6 = 0; lVar6 < p->vClassNew->nSize; lVar6 = lVar6 + 1) {
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vClassNew,(int)lVar6);
      ppAVar4[lVar6] = pAVar2;
      ppAVar4[p->vClassNew->nSize + lVar6] = (Aig_Obj_t *)0x0;
      if (lVar6 == 0) {
        pAVar3 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar3 = *ppAVar4;
      }
      *(Aig_Obj_t **)
       (*(long *)(*(long *)((long)(pAVar2->field_5).pData + 0x30) + 8) + (long)pAVar2->Id * 8) =
           pAVar3;
    }
    return ppAVar4;
  }
  __assert_fail("ppClass[0] != NULL && ppClass[1] != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClass.c"
                ,0x192,"Aig_Obj_t **Fra_RefineClassOne(Fra_Cla_t *, Aig_Obj_t **)");
}

Assistant:

Aig_Obj_t ** Fra_RefineClassOne( Fra_Cla_t * p, Aig_Obj_t ** ppClass )
{
    Aig_Obj_t * pObj, ** ppThis;
    int i;
    assert( ppClass[0] != NULL && ppClass[1] != NULL );

    // check if the class is going to be refined
    for ( ppThis = ppClass + 1; (pObj = *ppThis); ppThis++ )        
        if ( !p->pFuncNodesAreEqual(ppClass[0], pObj) )
            break;
    if ( pObj == NULL )
        return NULL;
    // split the class
    Vec_PtrClear( p->vClassOld );
    Vec_PtrClear( p->vClassNew );
    Vec_PtrPush( p->vClassOld, ppClass[0] );
    for ( ppThis = ppClass + 1; (pObj = *ppThis); ppThis++ )        
        if ( p->pFuncNodesAreEqual(ppClass[0], pObj) )
            Vec_PtrPush( p->vClassOld, pObj );
        else
            Vec_PtrPush( p->vClassNew, pObj );
/*
    printf( "Refining class (" );
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vClassOld, pObj, i )
        printf( "%d,", pObj->Id );
    printf( ") + (" );
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vClassNew, pObj, i )
        printf( "%d,", pObj->Id );
    printf( ")\n" );
*/
    // put the nodes back into the class memory
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vClassOld, pObj, i )
    {
        ppClass[i] = pObj;
        ppClass[Vec_PtrSize(p->vClassOld)+i] = NULL;
        Fra_ClassObjSetRepr( pObj, i? ppClass[0] : NULL );
    }
    ppClass += 2*Vec_PtrSize(p->vClassOld);
    // put the new nodes into the class memory
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vClassNew, pObj, i )
    {
        ppClass[i] = pObj;
        ppClass[Vec_PtrSize(p->vClassNew)+i] = NULL;
        Fra_ClassObjSetRepr( pObj, i? ppClass[0] : NULL );
    }
    return ppClass;
}